

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_file.c
# Opt level: O0

int write_FFSfile_attrs(FFSFile f,FMFormat_conflict format,void *data,attr_list attrs)

{
  int iVar1;
  char *attr_list;
  FFSEncodeVector pFVar2;
  uint *puVar3;
  long in_RCX;
  FMFormat_conflict in_RSI;
  FMFormat_conflict in_RDI;
  AttrBuffer b;
  char *attr_block;
  int attr_len;
  char *id;
  int id_len;
  int indicator [2];
  FFSEncodeVector vec;
  int vec_count;
  int index;
  long byte_size;
  void *in_stack_00000f98;
  FMFormat_conflict in_stack_00000fa0;
  FFSBuffer in_stack_00000fa8;
  FFSFile f_00;
  int index_00;
  int id_len_00;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  FFSFile in_stack_ffffffffffffffc0;
  FFSEncodeVector pFVar4;
  int local_38;
  long local_30;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = in_RSI->format_index;
  id_len_00 = 0;
  attr_list = get_server_ID_FMformat(in_RSI,(int *)&stack0xffffffffffffffb4);
  index_00 = 0;
  f_00 = (FFSFile)0x0;
  if (in_RCX != 0) {
    f_00 = (FFSFile)create_AttrBuffer();
    encode_attr_for_xmit(in_RCX,f_00,&stack0xffffffffffffffa4);
  }
  if (*(int *)&in_RDI->format_name != 1) {
    index_00 = 0;
  }
  init_format_info(f_00,index_00);
  if ((*(int *)((in_RDI->server_ID).value + (long)iVar1 * 4) == 0) &&
     (iVar1 = write_format_to_file
                        ((FFSFile)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI), iVar1 != 1)) {
    iVar1 = 0;
  }
  else {
    output_data_index(in_stack_ffffffffffffffc0,
                      (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      id_len_00,attr_list,index_00);
    pFVar2 = FFSencode_vector(in_stack_00000fa8,in_stack_00000fa0,in_stack_00000f98);
    local_38 = 0;
    local_30 = 0;
    while (pFVar2[local_38].iov_base != (void *)0x0) {
      local_30 = pFVar2[local_38].iov_len + local_30;
      local_38 = local_38 + 1;
    }
    htonl((int)((ulong)local_30 >> 0x20) + 0x3000000);
    htonl((uint32_t)local_30);
    pFVar4 = pFVar2 + -1;
    local_38 = local_38 + 1;
    pFVar2[-1].iov_len = 8;
    pFVar4->iov_base = &stack0xffffffffffffffb8;
    for (; *(int *)&in_RDI[1].format_name < local_38;
        local_38 = local_38 - *(int *)&in_RDI[1].format_name) {
      iVar1 = (**(code **)&in_RDI[1].format_index)
                        (*(undefined8 *)&in_RDI->server_ID,pFVar4,
                         *(undefined4 *)&in_RDI[1].format_name,0);
      if (iVar1 != *(int *)&in_RDI[1].format_name) {
        puVar3 = (uint *)__errno_location();
        printf("Write failed, errno %d\n",(ulong)*puVar3);
        return 0;
      }
      pFVar4 = pFVar4 + *(int *)&in_RDI[1].format_name;
    }
    iVar1 = (**(code **)&in_RDI[1].format_index)
                      (*(undefined8 *)&in_RDI->server_ID,pFVar4,local_38,0);
    if (iVar1 == local_38) {
      if (f_00 != (FFSFile)0x0) {
        free_AttrBuffer(f_00);
      }
      *(int *)&in_RDI->var_list = *(int *)&in_RDI->var_list + 1;
      update_fpos((FFSFile)0x121cdd);
      iVar1 = 1;
    }
    else {
      puVar3 = (uint *)__errno_location();
      printf("Write failed, errno %d\n",(ulong)*puVar3);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

extern int
write_FFSfile_attrs(FFSFile f, FMFormat format, void *data, attr_list attrs)
{
    DATA_LEN_TYPE byte_size;
    int index = format->format_index;
    int vec_count;
    FFSEncodeVector vec;
    int indicator[2];
    int id_len = 0;
    char *id = get_server_ID_FMformat(format, &id_len);
    int attr_len = 0;
    char *attr_block = NULL;
    AttrBuffer b = NULL;

    if (attrs) {
	b = create_AttrBuffer();
	attr_block = encode_attr_for_xmit(attrs, b, &attr_len);
    }

    attr_len = (f->file_org == Indexed)?attr_len:0;

    init_format_info(f, index);
    if (!f->info[index].written_to_file) {
	if (write_format_to_file(f, format) != 1) return 0;
    }

    output_data_index(f, id, id_len, attr_block, attr_len);
    //build_reverse_index(f, attr_list, attr_len);
    // Above ... deepak u need to replace attr_list with attr_block
    vec = FFSencode_vector(f->buf, format, data);
    vec_count = 0;
    byte_size = 0;
    while (vec[vec_count].iov_base != NULL) {
	byte_size += vec[vec_count].iov_len;
	vec_count++;
    }

    /*
     * next_data indicator is two 4-byte chunks in network byte order.
     * The top byte is 0x3.  The next byte is reserved for future use.
     * The following 6-bytes are the size of the data -- assume size fits
     * in a signed int.
     */
    indicator[0] = htonl((0x3 << 24) + (byte_size >> 32));
    indicator[1] = htonl(byte_size & 0xffffffff); 

    /* 
     *  utilize the fact that we have some blank vec entries *before the 
     *  beginning* of the vec we are given.  see ffs.c 
     */
    vec--;
    vec_count++;
    vec[0].iov_len = 8;
    vec[0].iov_base = indicator;
    while (vec_count > f->max_iov) {
	/* 
	 * if iovcnt is more than the number of chunks we can write in a 
	 * single AtomicWriteV, loop to write out max allowed.
	 */
	if (f->writev_func(f->file_id, (struct iovec *)vec, f->max_iov, 
			   NULL, NULL) != f->max_iov) {
	    printf("Write failed, errno %d\n", errno);
	    return 0;
	}
	vec_count -= f->max_iov;
	vec += f->max_iov;
    }
    if (f->writev_func(f->file_id, (struct iovec *)vec, vec_count, 
		       NULL, NULL) != vec_count) {
	printf("Write failed, errno %d\n", errno);
	return 0;
    }
    if (b) free_AttrBuffer(b);

    f->data_count++;
    update_fpos(f);
    return 1;
}